

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void expr_emit_arith(Parser *psr,Tk binop,Node *left,Node right)

{
  NodeType NVar1;
  Node *node;
  byte bVar2;
  byte bVar3;
  BcOp BVar4;
  int iVar5;
  NodeType NVar6;
  int iVar7;
  undefined4 in_register_00000034;
  Node *node_00;
  double dVar8;
  Node local_58;
  Node local_48;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,binop);
  local_48.field_1 = right.field_1;
  NVar6 = right.type;
  if (NVar6 == NODE_PRIM) {
    psr_trigger_err(psr,"invalid operand to binary operator");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x2fa,"void expr_emit_arith(Parser *, Tk, Node *, Node)");
  }
  NVar1 = left->type;
  if (NVar1 != NODE_NUM || NVar6 != NODE_NUM) goto LAB_00111b93;
  switch(binop) {
  case 0x2a:
    dVar8 = local_48.field_1.num * (left->field_1).num;
    break;
  case 0x2b:
    dVar8 = local_48.field_1.num + (left->field_1).num;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                  ,0x2f0,"_Bool expr_fold_arith(Tk, Node *, Node)");
  case 0x2d:
    dVar8 = (left->field_1).num - local_48.field_1.num;
    goto LAB_00111b7a;
  case 0x2f:
    dVar8 = (left->field_1).num / local_48.field_1.num;
LAB_00111b7a:
    (left->field_1).num = dVar8;
    goto LAB_00111b8b;
  }
  (left->field_1).num = dVar8;
LAB_00111b8b:
  if (NVar1 != NODE_NUM || NVar6 != NODE_NUM) {
LAB_00111b93:
    if ((((binop - 0x106U < 2) || (binop - 0x2aU < 2)) && (NVar1 < NODE_RELOC)) &&
       (NVar1 != NODE_LOCAL)) {
      local_58.type = NVar6;
      local_48._0_8_ = *(undefined8 *)left;
      local_58.field_1 = local_48.field_1;
      local_48.field_1 = left->field_1;
    }
    else {
      local_58._0_8_ = *(undefined8 *)left;
      local_58.field_1 = left->field_1;
      local_48.type = NVar6;
    }
    bVar2 = expr_to_ins_arg(psr,&local_58);
    bVar3 = expr_to_ins_arg(psr,&local_48);
    node_00 = &local_58;
    node = &local_48;
    if (bVar3 < bVar2) {
      node_00 = &local_48;
      node = &local_58;
    }
    expr_free_node(psr,node);
    expr_free_node(psr,node_00);
    BVar4 = binop_opcode((Tk)local_38);
    iVar7 = 0;
    iVar5 = 0;
    if ((local_48._0_8_ & 0xffffffff) < 4) {
      iVar5 = *(int *)(&DAT_00139a90 + (local_48._0_8_ & 0xffffffff) * 4);
    }
    if ((local_58._0_8_ & 0xffffffff) < 4) {
      iVar7 = *(int *)(&DAT_00139a80 + (local_58._0_8_ & 0xffffffff) * 4);
    }
    iVar5 = fn_emit(psr->vm->fns + psr->scope->fn,
                    (uint)bVar3 << 0x18 | (uint)bVar2 << 0x10 | iVar5 + BVar4 + iVar7);
    left->type = NODE_RELOC;
    (left->field_1).reloc_idx = iVar5;
  }
  return;
}

Assistant:

static void expr_emit_arith(Parser *psr, Tk binop, Node *left, Node right) {
	// Check for valid operand types
	if (right.type == NODE_PRIM) {
		psr_trigger_err(psr, "invalid operand to binary operator");
		UNREACHABLE();
	}

	// Check if we can fold the arithmetic operation
	if (expr_fold_arith(binop, left, right)) {
		return;
	}

	// If the arithemtic operator is commutative, we need to make sure the
	// constant number is on the right
	Node *result = left;
	Node l, r;
	if (binop_is_commutative(binop) && node_is_const(left)) {
		l = right;
		r = *left;
	} else {
		l = *left;
		r = right;
	}

	// Convert the operands into instruction args
	uint8_t larg = expr_to_ins_arg(psr, &l);
	uint8_t rarg = expr_to_ins_arg(psr, &r);

	// Assuming both left and right represent slots (and not an index into
	// the context's constants array), we need to free temporary slots.
	// Since temporary slots need to be free'd from top down, the order
	// depends on if left or right is the most recently allocated temporary
	// slot
	if (larg > rarg) {
		expr_free_node(psr, &l);
		expr_free_node(psr, &r);
	} else {
		expr_free_node(psr, &r);
		expr_free_node(psr, &l);
	}

	// Calculate the opcode to use off the binary operator
	BcOp opcode = binop_opcode(binop) + node_is_const(&r) +
		node_is_const(&l) * 2;

	// Generate the relocatable bytecode instruction
	BcIns ins = bc_new3(opcode, 0, larg, rarg);
	int idx = fn_emit(psr_fn(psr), ins);

	// Set the result as a relocatable node
	result->type = NODE_RELOC;
	result->reloc_idx = idx;
}